

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_sse2.c
# Opt level: O2

void PredictorAdd11_SSE2(uint32_t *in,uint32_t *upper,int num_pixels,uint32_t *out)

{
  char *pcVar1;
  undefined1 auVar2 [16];
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  long lVar11;
  long lVar12;
  undefined1 auVar13 [16];
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined8 uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined4 uVar33;
  undefined1 auVar34 [16];
  undefined1 auVar36 [16];
  undefined1 auVar38 [16];
  undefined1 auVar40 [16];
  undefined1 auVar27 [16];
  undefined1 auVar35 [16];
  undefined1 auVar37 [16];
  undefined1 auVar39 [16];
  undefined1 auVar41 [16];
  
  auVar25 = ZEXT416(out[-1]);
  lVar11 = 0;
  lVar12 = 0;
  while( true ) {
    if ((long)num_pixels < lVar12 + 4) break;
    auVar13 = *(undefined1 (*) [16])((long)upper + lVar11 + -4);
    auVar2 = *(undefined1 (*) [16])((long)upper + lVar11);
    pcVar1 = (char *)((long)in + lVar11);
    cVar3 = pcVar1[8];
    cVar4 = pcVar1[9];
    cVar5 = pcVar1[10];
    cVar6 = pcVar1[0xb];
    cVar7 = pcVar1[0xc];
    cVar8 = pcVar1[0xd];
    cVar9 = pcVar1[0xe];
    cVar10 = pcVar1[0xf];
    uVar14 = auVar2._0_4_;
    uVar15 = auVar2._4_4_;
    uVar16 = auVar2._8_4_;
    uVar17 = auVar2._12_4_;
    auVar30._4_4_ = uVar14;
    auVar30._0_4_ = uVar14;
    auVar30._8_4_ = uVar15;
    auVar30._12_4_ = uVar15;
    auVar35._0_8_ = auVar13._0_8_;
    auVar35._8_4_ = auVar13._4_4_;
    auVar35._12_4_ = uVar15;
    auVar34._8_8_ = auVar35._8_8_;
    auVar34._0_4_ = auVar13._0_4_;
    auVar34._4_4_ = uVar14;
    auVar21._4_4_ = uVar16;
    auVar21._0_4_ = uVar16;
    auVar21._8_4_ = uVar17;
    auVar21._12_4_ = uVar17;
    auVar23._4_4_ = uVar16;
    auVar23._0_4_ = auVar13._8_4_;
    auVar23._8_4_ = auVar13._12_4_;
    auVar23._12_4_ = uVar17;
    auVar31 = psadbw(auVar30,auVar34);
    auVar21 = psadbw(auVar21,auVar23);
    auVar32 = packssdw(auVar31,auVar21);
    auVar18._8_4_ = auVar25._4_4_;
    auVar18._0_8_ = auVar25._0_8_;
    auVar18._12_4_ = uVar15;
    auVar22._8_8_ = auVar18._8_8_;
    auVar22._0_4_ = auVar25._0_4_;
    auVar22._4_4_ = uVar14;
    auVar31 = psadbw(auVar22,auVar34);
    auVar19._0_4_ = -(uint)(auVar32._0_4_ < auVar31._0_4_);
    auVar19._4_4_ = -(uint)(auVar32._4_4_ < auVar31._4_4_);
    auVar19._8_4_ = -(uint)(auVar32._8_4_ < auVar31._8_4_);
    auVar19._12_4_ = -(uint)(auVar32._12_4_ < auVar31._12_4_);
    auVar25 = ~auVar19 & auVar2 | auVar25 & auVar19;
    uVar14 = CONCAT13(auVar25[3] + pcVar1[3],
                      CONCAT12(auVar25[2] + pcVar1[2],
                               CONCAT11(auVar25[1] + pcVar1[1],auVar25[0] + *pcVar1)));
    auVar20._0_8_ =
         CONCAT17(auVar25[7] + pcVar1[7],
                  CONCAT16(auVar25[6] + pcVar1[6],
                           CONCAT15(auVar25[5] + pcVar1[5],CONCAT14(auVar25[4] + pcVar1[4],uVar14)))
                 );
    auVar20[8] = auVar25[8] + cVar3;
    auVar20[9] = auVar25[9] + cVar4;
    auVar20[10] = auVar25[10] + cVar5;
    auVar20[0xb] = auVar25[0xb] + cVar6;
    auVar20[0xc] = auVar25[0xc] + cVar7;
    auVar20[0xd] = auVar25[0xd] + cVar8;
    auVar20[0xe] = auVar25[0xe] + cVar9;
    auVar20[0xf] = auVar25[0xf] + cVar10;
    auVar37._0_8_ = auVar13._4_8_;
    auVar41._8_4_ = (int)((ulong)auVar20._0_8_ >> 0x20);
    auVar41._0_8_ = auVar20._0_8_;
    auVar41._12_4_ = uVar16;
    auVar40._8_8_ = auVar41._8_8_;
    auVar40._4_4_ = uVar15;
    auVar40._0_4_ = uVar14;
    auVar37._8_4_ = auVar13._8_4_;
    auVar37._12_4_ = uVar16;
    auVar36._8_8_ = auVar37._8_8_;
    auVar36._4_4_ = uVar15;
    auVar36._0_4_ = auVar13._4_4_;
    auVar25 = psadbw(auVar36,auVar40);
    auVar38._0_4_ = -(uint)(auVar32._4_4_ < auVar25._0_4_);
    auVar38._4_4_ = -(uint)(auVar32._8_4_ < auVar25._4_4_);
    auVar38._8_4_ = -(uint)(auVar32._12_4_ < auVar25._8_4_);
    auVar38._12_4_ = -(uint)(0 < auVar25._12_4_);
    auVar25 = ~auVar38 & auVar2 >> 0x20 | auVar20 & auVar38;
    uVar33 = CONCAT13(auVar25[3] + pcVar1[7],
                      CONCAT12(auVar25[2] + pcVar1[6],
                               CONCAT11(auVar25[1] + pcVar1[5],auVar25[0] + pcVar1[4])));
    auVar39._0_8_ =
         CONCAT17(auVar25[7] + cVar6,
                  CONCAT16(auVar25[6] + cVar5,
                           CONCAT15(auVar25[5] + cVar4,CONCAT14(auVar25[4] + cVar3,uVar33))));
    auVar39[8] = auVar25[8] + cVar7;
    auVar39[9] = auVar25[9] + cVar8;
    auVar39[10] = auVar25[10] + cVar9;
    auVar39[0xb] = auVar25[0xb] + cVar10;
    auVar39[0xc] = auVar25[0xc];
    auVar39[0xd] = auVar25[0xd];
    auVar39[0xe] = auVar25[0xe];
    auVar39[0xf] = auVar25[0xf];
    auVar22 = packssdw(auVar21,(undefined1  [16])0x0);
    auVar27._8_4_ = (int)((ulong)auVar39._0_8_ >> 0x20);
    auVar27._0_8_ = auVar39._0_8_;
    auVar27._12_4_ = uVar17;
    auVar26._8_8_ = auVar27._8_8_;
    auVar26._4_4_ = uVar16;
    auVar26._0_4_ = uVar33;
    auVar25 = psadbw(auVar26,auVar23);
    auVar28._0_4_ = -(uint)(auVar22._0_4_ < auVar25._0_4_);
    auVar28._4_4_ = -(uint)(auVar22._4_4_ < auVar25._4_4_);
    auVar28._8_4_ = -(uint)(auVar22._8_4_ < auVar25._8_4_);
    auVar28._12_4_ = -(uint)(auVar22._12_4_ < auVar25._12_4_);
    auVar25 = ~auVar28 & auVar2 >> 0x40 | auVar39 & auVar28;
    uVar15 = CONCAT13(auVar25[3] + cVar6,
                      CONCAT12(auVar25[2] + cVar5,CONCAT11(auVar25[1] + cVar4,auVar25[0] + cVar3)));
    auVar29._0_8_ =
         CONCAT17(auVar25[7] + cVar10,
                  CONCAT16(auVar25[6] + cVar9,
                           CONCAT15(auVar25[5] + cVar8,CONCAT14(auVar25[4] + cVar7,uVar15))));
    auVar29[8] = auVar25[8];
    auVar29[9] = auVar25[9];
    auVar29[10] = auVar25[10];
    auVar29[0xb] = auVar25[0xb];
    auVar29[0xc] = auVar25[0xc];
    auVar29[0xd] = auVar25[0xd];
    auVar29[0xe] = auVar25[0xe];
    auVar29[0xf] = auVar25[0xf];
    auVar32._4_4_ = uVar17;
    auVar32._0_4_ = uVar15;
    auVar32._8_4_ = (int)((ulong)auVar29._0_8_ >> 0x20);
    auVar32._12_4_ = 0;
    auVar31._4_4_ = uVar17;
    auVar31._0_4_ = auVar13._12_4_;
    auVar31._8_8_ = 0;
    auVar25 = psadbw(auVar31,auVar32);
    auVar13._0_4_ = -(uint)(auVar22._4_4_ < auVar25._0_4_);
    auVar13._4_4_ = -(uint)(auVar22._8_4_ < auVar25._4_4_);
    auVar13._8_4_ = -(uint)(auVar22._12_4_ < auVar25._8_4_);
    auVar13._12_4_ = -(uint)(0 < auVar25._12_4_);
    auVar13 = ~auVar13 & auVar2 >> 0x60 | auVar29 & auVar13;
    auVar25._0_4_ =
         CONCAT13(auVar13[3] + cVar10,
                  CONCAT12(auVar13[2] + cVar9,CONCAT11(auVar13[1] + cVar8,auVar13[0] + cVar7)));
    auVar25[4] = auVar13[4];
    auVar25[5] = auVar13[5];
    auVar25[6] = auVar13[6];
    auVar25[7] = auVar13[7];
    auVar25[8] = auVar13[8];
    auVar25[9] = auVar13[9];
    auVar25[10] = auVar13[10];
    auVar25[0xb] = auVar13[0xb];
    auVar25[0xc] = auVar13[0xc];
    auVar25[0xd] = auVar13[0xd];
    auVar25[0xe] = auVar13[0xe];
    auVar25[0xf] = auVar13[0xf];
    uVar24 = CONCAT44(auVar25._0_4_,uVar15);
    *(undefined8 *)((long)out + lVar11) = CONCAT44(uVar33,uVar14);
    ((undefined8 *)((long)out + lVar11))[1] = uVar24;
    lVar11 = lVar11 + 0x10;
    lVar12 = lVar12 + 4;
  }
  if (num_pixels == (int)lVar12) {
    return;
  }
  (*VP8LPredictorsAdd_C[0xb])
            ((uint32_t *)((long)in + lVar11),(uint32_t *)((long)upper + lVar11),
             num_pixels - (int)lVar12,(uint32_t *)((long)out + lVar11));
  return;
}

Assistant:

static void PredictorAdd11_SSE2(const uint32_t* in, const uint32_t* upper,
                                int num_pixels, uint32_t* WEBP_RESTRICT out) {
  int i;
  __m128i pa;
  __m128i L = _mm_cvtsi32_si128((int)out[-1]);
  for (i = 0; i + 4 <= num_pixels; i += 4) {
    __m128i T = _mm_loadu_si128((const __m128i*)&upper[i]);
    __m128i TL = _mm_loadu_si128((const __m128i*)&upper[i - 1]);
    __m128i src = _mm_loadu_si128((const __m128i*)&in[i]);
    {
      // We can unpack with any value on the upper 32 bits, provided it's the
      // same on both operands (so that their sum of abs diff is zero). Here we
      // use T.
      const __m128i T_lo = _mm_unpacklo_epi32(T, T);
      const __m128i TL_lo = _mm_unpacklo_epi32(TL, T);
      const __m128i T_hi = _mm_unpackhi_epi32(T, T);
      const __m128i TL_hi = _mm_unpackhi_epi32(TL, T);
      const __m128i s_lo = _mm_sad_epu8(T_lo, TL_lo);
      const __m128i s_hi = _mm_sad_epu8(T_hi, TL_hi);
      pa = _mm_packs_epi32(s_lo, s_hi);  // pa = sum |T-TL|
    }
    DO_PRED11(0);
    DO_PRED11_SHIFT;
    DO_PRED11(1);
    DO_PRED11_SHIFT;
    DO_PRED11(2);
    DO_PRED11_SHIFT;
    DO_PRED11(3);
  }
  if (i != num_pixels) {
    VP8LPredictorsAdd_C[11](in + i, upper + i, num_pixels - i, out + i);
  }
}